

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O3

void __thiscall
Assimp::DXFImporter::ParsePolyLineVertex(DXFImporter *this,LineReader *reader,PolyLine *line)

{
  pointer *ppuVar1;
  pointer *ppaVar2;
  pointer *ppaVar3;
  size_t __n;
  iterator iVar4;
  iterator __position;
  pointer puVar5;
  iterator __position_00;
  int iVar6;
  char *pcVar7;
  Logger *pLVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  char cVar14;
  bool bVar15;
  uint cnti;
  aiColor4D clr;
  uint indices [4];
  float local_70;
  uint local_6c;
  aiVector3t<float> local_68;
  aiColor4D local_58;
  int aiStack_48 [6];
  
  uVar12 = 0;
  local_6c = 0;
  local_68.x = 0.0;
  local_68.y = 0.0;
  local_68.z = 0.0;
  local_58 = AI_DXF_DEFAULT_COLOR;
  bVar15 = true;
  if (reader->end < 2) {
    uVar12 = 0;
    uVar11 = 0;
    cVar14 = '\0';
    do {
      iVar6 = reader->groupcode;
      if (iVar6 < 0x3e) {
        if (iVar6 < 0x14) {
          if (iVar6 == 8) {
            __n = (reader->value)._M_string_length;
            if ((__n != (line->layer)._M_string_length) ||
               ((__n != 0 &&
                (iVar6 = bcmp((reader->value)._M_dataplus._M_p,(line->layer)._M_dataplus._M_p,__n),
                iVar6 != 0)))) {
              pLVar8 = DefaultLogger::get();
              Logger::warn(pLVar8,
                           "DXF: expected vertex to be part of a poly-face but the 0x128 flag isn\'t set"
                          );
            }
          }
          else if (iVar6 == 10) {
            local_70 = 0.0;
            fast_atoreal_move<float>((reader->value)._M_dataplus._M_p,&local_70,true);
            local_68.x = local_70;
          }
          else if (iVar6 == 0) break;
        }
        else if (iVar6 == 0x14) {
          local_70 = 0.0;
          fast_atoreal_move<float>((reader->value)._M_dataplus._M_p,&local_70,true);
          local_68.y = local_70;
        }
        else if (iVar6 == 0x1e) {
          local_70 = 0.0;
          fast_atoreal_move<float>((reader->value)._M_dataplus._M_p,&local_70,true);
          local_68.z = local_70;
        }
      }
      else if (iVar6 - 0x47U < 4) {
        if (uVar11 == 4) {
          pLVar8 = DefaultLogger::get();
          Logger::warn(pLVar8,"DXF: more than 4 indices per face not supported; ignoring");
          uVar11 = 4;
        }
        else {
          pcVar7 = (reader->value)._M_dataplus._M_p;
          cVar9 = *pcVar7;
          iVar6 = 0;
          if (0xf5 < (byte)(cVar9 - 0x3aU)) {
            iVar6 = 0;
            do {
              pcVar7 = pcVar7 + 1;
              iVar6 = (uint)(byte)(cVar9 - 0x30) + iVar6 * 10;
              cVar9 = *pcVar7;
            } while (0xf5 < (byte)(cVar9 - 0x3aU));
          }
          uVar12 = uVar11 + 1;
          aiStack_48[uVar11] = iVar6;
          uVar11 = uVar12;
          local_6c = uVar12;
        }
      }
      else if (iVar6 == 0x3e) {
        pcVar7 = (reader->value)._M_dataplus._M_p;
        cVar9 = *pcVar7;
        if ((byte)(cVar9 - 0x3aU) < 0xf6) {
          uVar10 = 0;
        }
        else {
          uVar10 = 0;
          do {
            pcVar7 = pcVar7 + 1;
            uVar10 = (uint)(byte)(cVar9 - 0x30) + uVar10 * 10;
            cVar9 = *pcVar7;
          } while (0xf5 < (byte)(cVar9 - 0x3aU));
          uVar10 = uVar10 & 0xf;
        }
        local_58 = *(aiColor4D *)((long)&g_aclrDxfIndexColors[0].r + (ulong)(uVar10 << 4));
      }
      else if (iVar6 == 0x46) {
        pcVar7 = (reader->value)._M_dataplus._M_p;
        cVar9 = *pcVar7;
        cVar14 = '\0';
        if (0xf5 < (byte)(cVar9 - 0x3aU)) {
          cVar14 = '\0';
          do {
            pcVar7 = pcVar7 + 1;
            cVar14 = cVar9 + -0x30 + cVar14 * '\n';
            cVar9 = *pcVar7;
          } while (0xf5 < (byte)(cVar9 - 0x3aU));
        }
      }
      DXF::LineReader::operator++(reader);
    } while (reader->end < 2);
    bVar15 = -1 < cVar14;
  }
  if (((line->flags & 0x40) != 0) && (bVar15)) {
    pLVar8 = DefaultLogger::get();
    Logger::warn(pLVar8,
                 "DXF: expected vertex to be part of a polyface but the 0x128 flag isn\'t set");
  }
  if (uVar12 == 0) {
    __position._M_current =
         (line->positions).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (line->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)line,__position,
                 &local_68);
    }
    else {
      (__position._M_current)->z = local_68.z;
      (__position._M_current)->x = local_68.x;
      (__position._M_current)->y = local_68.y;
      ppaVar2 = &(line->positions).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar2 = *ppaVar2 + 1;
    }
    __position_00._M_current =
         (line->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (line->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
      _M_realloc_insert<aiColor4t<float>const&>
                ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)&line->colors,
                 __position_00,&local_58);
    }
    else {
      (__position_00._M_current)->r = local_58.r;
      (__position_00._M_current)->g = local_58.g;
      (__position_00._M_current)->b = local_58.b;
      (__position_00._M_current)->a = local_58.a;
      ppaVar3 = &(line->colors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar3 = *ppaVar3 + 1;
    }
  }
  else {
    iVar4._M_current =
         (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&line->counts,iVar4,&local_6c)
      ;
      if (local_6c == 0) {
        return;
      }
    }
    else {
      *iVar4._M_current = uVar12;
      ppuVar1 = &(line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    uVar13 = 0;
    do {
      if (aiStack_48[uVar13] == 0) {
        pLVar8 = DefaultLogger::get();
        Logger::warn(pLVar8,"DXF: invalid vertex index, indices are one-based.");
        puVar5 = (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1;
        *puVar5 = *puVar5 - 1;
        puVar5 = (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (puVar5[-1] == 0) {
          (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar5 + -1;
        }
      }
      else {
        local_70 = (float)(aiStack_48[uVar13] + -1);
        iVar4._M_current =
             (line->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (line->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&line->indices,iVar4,(uint *)&local_70);
        }
        else {
          *iVar4._M_current = (uint)local_70;
          ppuVar1 = &(line->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < local_6c);
  }
  return;
}

Assistant:

void DXFImporter::ParsePolyLineVertex(DXF::LineReader& reader, DXF::PolyLine& line) {
    unsigned int cnti = 0, flags = 0;
    unsigned int indices[4];

    aiVector3D out;
    aiColor4D clr = AI_DXF_DEFAULT_COLOR;

    while( !reader.End() ) {

        if (reader.Is(0)) { // SEQEND or another VERTEX
            break;
        }

        switch (reader.GroupCode()) {
        case 8:
                // layer to which the vertex belongs to - assume that
                // this is always the layer the top-level poly-line
                // entity resides on as well.
                if(reader.Value() != line.layer) {
                    ASSIMP_LOG_WARN("DXF: expected vertex to be part of a poly-face but the 0x128 flag isn't set");
                }
                break;

        case 70:
                flags = reader.ValueAsUnsignedInt();
                break;

        // VERTEX COORDINATES
        case GroupCode_XComp:
            out.x = reader.ValueAsFloat();
            break;

        case GroupCode_YComp:
            out.y = reader.ValueAsFloat();
            break;

        case GroupCode_ZComp:
            out.z = reader.ValueAsFloat();
            break;

        // POLYFACE vertex indices
        case 71:
        case 72:
        case 73:
        case 74:
            if (cnti == 4) {
                ASSIMP_LOG_WARN("DXF: more than 4 indices per face not supported; ignoring");
                break;
            }
            indices[cnti++] = reader.ValueAsUnsignedInt();
            break;

        // color
        case 62:
            clr = g_aclrDxfIndexColors[reader.ValueAsUnsignedInt() % AI_DXF_NUM_INDEX_COLORS];
            break;
        };

        reader++;
    }

    if (line.flags & DXF_POLYLINE_FLAG_POLYFACEMESH && !(flags & DXF_VERTEX_FLAG_PART_OF_POLYFACE)) {
        ASSIMP_LOG_WARN("DXF: expected vertex to be part of a polyface but the 0x128 flag isn't set");
    }

    if (cnti) {
        line.counts.push_back(cnti);
        for (unsigned int i = 0; i < cnti; ++i) {
            // IMPORTANT NOTE: POLYMESH indices are ONE-BASED
            if (indices[i] == 0) {
                ASSIMP_LOG_WARN("DXF: invalid vertex index, indices are one-based.");
                --line.counts.back();
                // Workaround to fix issue 2229
                if (line.counts.back() == 0) {
                    line.counts.pop_back();
                }
                continue;
            }
            line.indices.push_back(indices[i]-1);
        }
    } else {
        line.positions.push_back(out);
        line.colors.push_back(clr);
    }
}